

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

bool __thiscall
QGraphicsScenePrivate::filterDescendantEvent
          (QGraphicsScenePrivate *this,QGraphicsItem *item,QEvent *event)

{
  int iVar1;
  QGraphicsItem *this_00;
  ulong uVar2;
  
  if (item == (QGraphicsItem *)0x0) {
    return false;
  }
  this_00 = item;
  if ((((item->d_ptr).d)->field_0x162 & 8) != 0) {
    do {
      this_00 = QGraphicsItem::parentItem(this_00);
      if (this_00 == (QGraphicsItem *)0x0) {
        return false;
      }
      uVar2 = *(ulong *)&((this_00->d_ptr).d)->field_0x160;
      if ((uVar2 >> 0x3d & 1) != 0) {
        iVar1 = (*this_00->_vptr_QGraphicsItem[0xc])(this_00,item,event);
        if ((char)iVar1 != '\0') {
          return true;
        }
        uVar2 = *(ulong *)&((this_00->d_ptr).d)->field_0x160;
      }
    } while (((uint)uVar2 >> 0x13 & 1) != 0);
  }
  return false;
}

Assistant:

bool QGraphicsScenePrivate::filterDescendantEvent(QGraphicsItem *item, QEvent *event)
{
    if (item && (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents)) {
        QGraphicsItem *parent = item->parentItem();
        while (parent) {
            if (parent->d_ptr->filtersDescendantEvents && parent->sceneEventFilter(item, event))
                return true;
            if (!(parent->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorFiltersChildEvents))
                return false;
            parent = parent->parentItem();
        }
    }
    return false;
}